

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::LogicalOrExp(SQCompiler *this)

{
  SQCompiler *pSVar1;
  SQCompiler *pSVar2;
  SQFuncState *this_00;
  SQFuncState *in_RDI;
  SQInteger second_exp;
  SQInteger jpos;
  SQInteger trg;
  SQInteger first_exp;
  SQCompiler *in_stack_ffffffffffffffb0;
  SQFuncState *in_stack_ffffffffffffffb8;
  SQInteger in_stack_ffffffffffffffc8;
  SQInteger in_stack_ffffffffffffffd0;
  code *arg0;
  undefined8 in_stack_ffffffffffffffd8;
  SQOpcode _op;
  SQInteger pos;
  SQFuncState *in_stack_ffffffffffffffe0;
  SQCompiler *in_stack_fffffffffffffff0;
  
  _op = (SQOpcode)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  LogicalAndExp(in_stack_fffffffffffffff0);
  if (in_RDI->_returnexp == 0x10f) {
    pSVar1 = (SQCompiler *)SQFuncState::PopTarget(in_RDI);
    pSVar2 = (SQCompiler *)
             SQFuncState::PushTarget(in_stack_ffffffffffffffb8,(SQInteger)in_stack_ffffffffffffffb0)
    ;
    SQFuncState::AddInstruction
              (in_stack_ffffffffffffffe0,_op,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               (SQInteger)in_RDI,(SQInteger)in_stack_ffffffffffffffb8);
    this_00 = (SQFuncState *)SQFuncState::GetCurrentPos((SQFuncState *)0x11b1e0);
    if (pSVar2 != pSVar1) {
      SQFuncState::AddInstruction
                (this_00,_op,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(SQInteger)in_RDI,
                 (SQInteger)in_stack_ffffffffffffffb8);
    }
    Lex(in_stack_ffffffffffffffb0);
    arg0 = LogicalOrExp;
    pos = 0;
    INVOKE_EXP<void(SQCompiler::*)()>(pSVar1,(offset_in_SQCompiler_to_subr)this_00);
    SQFuncState::SnoozeOpt((SQFuncState *)(in_RDI->_vlocals)._vals);
    pSVar1 = (SQCompiler *)SQFuncState::PopTarget(in_RDI);
    if (pSVar2 != pSVar1) {
      SQFuncState::AddInstruction
                (this_00,(SQOpcode)((ulong)pos >> 0x20),(SQInteger)arg0,(SQInteger)pSVar1,
                 (SQInteger)in_RDI,(SQInteger)in_stack_ffffffffffffffb8);
    }
    SQFuncState::SnoozeOpt((SQFuncState *)(in_RDI->_vlocals)._vals);
    SQFuncState::GetCurrentPos((SQFuncState *)0x11b2ca);
    SQFuncState::SetInstructionParam(this_00,pos,(SQInteger)arg0,(SQInteger)pSVar1);
    (in_RDI->_instructions)._allocated = 1;
  }
  return;
}

Assistant:

void LogicalOrExp()
    {
        LogicalAndExp();
        for(;;) if(_token == TK_OR) {
            SQInteger first_exp = _fs->PopTarget();
            SQInteger trg = _fs->PushTarget();
            _fs->AddInstruction(_OP_OR, trg, 0, first_exp, 0);
            SQInteger jpos = _fs->GetCurrentPos();
            if(trg != first_exp) _fs->AddInstruction(_OP_MOVE, trg, first_exp);
            Lex(); INVOKE_EXP(&SQCompiler::LogicalOrExp);
            _fs->SnoozeOpt();
            SQInteger second_exp = _fs->PopTarget();
            if(trg != second_exp) _fs->AddInstruction(_OP_MOVE, trg, second_exp);
            _fs->SnoozeOpt();
            _fs->SetInstructionParam(jpos, 1, (_fs->GetCurrentPos() - jpos));
            _es.etype = EXPR;
            break;
        }else return;
    }